

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O2

void nni_task_init(nni_task *task,nni_taskq *tq,nni_cb cb,void *arg)

{
  (task->task_node).ln_next = (nni_list_node *)0x0;
  (task->task_node).ln_prev = (nni_list_node *)0x0;
  nni_mtx_init(&task->task_mtx);
  nni_cv_init(&task->task_cv,&task->task_mtx);
  task->task_prep = false;
  task->task_busy = 0;
  task->task_cb = cb;
  task->task_arg = arg;
  if (tq == (nni_taskq *)0x0) {
    tq = nni_taskq_systq;
  }
  task->task_tq = tq;
  return;
}

Assistant:

void
nni_task_init(nni_task *task, nni_taskq *tq, nni_cb cb, void *arg)
{
	NNI_LIST_NODE_INIT(&task->task_node);
	nni_mtx_init(&task->task_mtx);
	nni_cv_init(&task->task_cv, &task->task_mtx);
	task->task_prep = false;
	task->task_busy = 0;
	task->task_cb   = cb;
	task->task_arg  = arg;
	task->task_tq   = tq != NULL ? tq : nni_taskq_systq;
}